

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-proxy.c
# Opt level: O3

int main(int argc,char **argv)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar4;
  ssize_t sVar5;
  int *piVar6;
  char **ppcVar7;
  undefined8 extraout_RAX;
  int *piVar8;
  size_t sVar9;
  char *pcVar10;
  uint uVar11;
  undefined8 *extraout_RDX;
  uint *__buf;
  uchar cmd;
  char *pcVar12;
  telnet_t *telnet;
  undefined4 *puVar13;
  long lVar14;
  int rs;
  pollfd pfd [2];
  socklen_t addrlen;
  conn_t server;
  addrinfo *ai;
  conn_t client;
  char buffer [512];
  undefined8 uVar15;
  uint *buffer_00;
  sockaddr *__addr;
  code *pcVar16;
  pollfd *__fds;
  uint local_2f0;
  ushort local_2ea;
  pollfd local_2e8;
  undefined8 uStack_2e0;
  uint local_2d0;
  socklen_t local_2cc;
  char *local_2c8;
  int local_2c0;
  telnet_t *local_2b8;
  char **local_2b0;
  sockaddr local_2a8;
  addrinfo *local_298;
  char *local_290;
  int local_288;
  telnet_t *local_280;
  char **local_278;
  char **local_270;
  addrinfo local_268;
  uint local_238 [130];
  
  if (argc == 4) {
    lVar4 = strtol(argv[3],(char **)0x0,10);
    iVar2 = socket(2,1,0);
    if (iVar2 != -1) {
      uVar1 = (ushort)lVar4;
      local_2ea = uVar1 << 8 | uVar1 >> 8;
      local_2d0 = (uint)(short)uVar1;
      local_270 = argv + 1;
      __addr = &local_2a8;
      __fds = &local_2e8;
      buffer_00 = local_238;
      do {
        local_2f0 = 1;
        setsockopt(iVar2,1,2,&local_2f0,4);
        local_2a8.sa_data[6] = '\0';
        local_2a8.sa_data[7] = '\0';
        local_2a8.sa_data[8] = '\0';
        local_2a8.sa_data[9] = '\0';
        local_2a8.sa_data[10] = '\0';
        local_2a8.sa_data[0xb] = '\0';
        local_2a8.sa_data[0xc] = '\0';
        local_2a8.sa_data[0xd] = '\0';
        local_2a8.sa_data._0_2_ = local_2ea;
        local_2a8.sa_family = 2;
        local_2a8.sa_data._2_4_ = 0;
        iVar3 = bind(iVar2,__addr,0x10);
        if (iVar3 == -1) {
          main_cold_10();
          return 1;
        }
        printf("LISTENING ON PORT %d\n",(ulong)local_2d0);
        iVar3 = listen(iVar2,1);
        if (iVar3 == -1) {
          main_cold_9();
          return 1;
        }
        local_2cc = 0x10;
        local_288 = accept(iVar2,__addr,&local_2cc);
        if (local_288 == -1) {
          main_cold_8();
          return 1;
        }
        puts("CLIENT CONNECTION RECEIVED");
        close(iVar2);
        local_268.ai_flags = 0;
        local_268.ai_family = 0;
        local_268.ai_addrlen = 0;
        local_268._20_4_ = 0;
        local_268.ai_addr = (sockaddr *)0x0;
        local_268.ai_canonname = (char *)0x0;
        local_268.ai_next = (addrinfo *)0x0;
        local_268.ai_socktype = 1;
        local_268.ai_protocol = 0;
        local_2f0 = getaddrinfo(argv[1],argv[2],&local_268,&local_298);
        if (local_2f0 != 0) {
          main_cold_2();
          return 1;
        }
        local_2c0 = socket(2,1,0);
        if (local_2c0 == -1) {
          main_cold_7();
          return 1;
        }
        local_2a8.sa_data[6] = '\0';
        local_2a8.sa_data[7] = '\0';
        local_2a8.sa_data[8] = '\0';
        local_2a8.sa_data[9] = '\0';
        local_2a8.sa_data[10] = '\0';
        local_2a8.sa_data[0xb] = '\0';
        local_2a8.sa_data[0xc] = '\0';
        local_2a8.sa_data[0xd] = '\0';
        local_2a8.sa_family = 2;
        local_2a8.sa_data[0] = '\0';
        local_2a8.sa_data[1] = '\0';
        local_2a8.sa_data[2] = '\0';
        local_2a8.sa_data[3] = '\0';
        local_2a8.sa_data[4] = '\0';
        local_2a8.sa_data[5] = '\0';
        iVar2 = bind(local_2c0,__addr,0x10);
        if (iVar2 == -1) {
          main_cold_6();
          return 1;
        }
        iVar2 = connect(local_2c0,local_298->ai_addr,local_298->ai_addrlen);
        if (iVar2 == -1) {
          main_cold_5();
          return 1;
        }
        freeaddrinfo(local_298);
        puts("SERVER CONNECTION ESTABLISHED");
        local_2c8 = "SERVER";
        ppcVar7 = &local_290;
        local_290 = "CLIENT";
        local_278 = &local_2c8;
        local_2b0 = ppcVar7;
        local_2b8 = telnet_init((telnet_telopt_t *)0x0,_event_handler,'\x01',local_278);
        local_280 = telnet_init((telnet_telopt_t *)0x0,_event_handler,'\x01',ppcVar7);
        local_2e8.events = 1;
        local_2e8.fd = local_2c0;
        local_2e8.revents = 0;
        uStack_2e0 = (ulong)CONCAT24(1,local_288);
LAB_001018d3:
        iVar2 = poll(__fds,2,-1);
        if (iVar2 != -1) {
          if (((ulong)local_2e8 & 0x19000000000000) == 0) goto LAB_0010193e;
          __buf = buffer_00;
          sVar5 = recv(local_2c0,buffer_00,0x200,0);
          local_2f0 = (uint)sVar5;
          if (0 < (int)local_2f0) {
            telnet_recv(local_2b8,(char *)buffer_00,(ulong)(local_2f0 & 0x7fffffff));
            goto LAB_0010193e;
          }
          if (local_2f0 == 0) {
            ppcVar7 = &local_2c8;
            goto LAB_001019a6;
          }
          piVar6 = __errno_location();
          if ((*piVar6 == 4) || (*piVar6 == 0x68)) goto LAB_0010193e;
          main_cold_3();
          goto LAB_00101a7d;
        }
LAB_001019b7:
        telnet_free(local_2b8);
        telnet_free(local_280);
        close(local_2c0);
        close(local_288);
        puts("BOTH CONNECTIONS CLOSED");
        iVar2 = socket(2,1,0);
      } while (iVar2 != -1);
    }
    main_cold_11();
  }
  else {
    main_cold_1();
  }
  return 1;
LAB_0010193e:
  if ((uStack_2e0 & 0x19000000000000) != 0) {
    __buf = buffer_00;
    sVar5 = recv(local_288,buffer_00,0x200,0);
    local_2f0 = (uint)sVar5;
    if ((int)local_2f0 < 1) {
      if (local_2f0 == 0) {
        ppcVar7 = &local_290;
LAB_001019a6:
        printf("%s DISCONNECTED\n",*ppcVar7);
        goto LAB_001019b7;
      }
      piVar6 = __errno_location();
      if ((*piVar6 != 4) && (*piVar6 != 0x68)) {
LAB_00101a7d:
        main_cold_4();
        pcVar16 = _event_handler;
        piVar8 = (int *)(ulong)*__buf;
        piVar6 = piVar8;
        if ((int *)0xe < piVar8) goto switchD_00101aad_default;
        piVar6 = (int *)((long)&switchD_00101aad::switchdataD_00105020 +
                        (long)(int)(&switchD_00101aad::switchdataD_00105020)[(long)piVar8]);
        uVar15 = extraout_RAX;
        switch(piVar8) {
        case (int *)0x0:
          printf("%s DATA: ",*extraout_RDX);
          print_buffer(*(char **)(__buf + 2),*(size_t *)(__buf + 4));
          putchar(10);
          telnet_send(*(telnet_t **)(extraout_RDX[3] + 0x10),*(char **)(__buf + 2),
                      *(size_t *)(__buf + 4));
          return extraout_EAX;
        case (int *)0x1:
          lVar4 = *(long *)(__buf + 4);
          if (lVar4 == 0) goto switchD_00101aad_default;
          iVar2 = *(int *)(extraout_RDX + 1);
          __buf = *(uint **)(__buf + 2);
          goto LAB_00101e2d;
        case (int *)0x2:
          uVar15 = *extraout_RDX;
          if ((byte)__buf[1] < 0xec) {
            puVar13 = &get_cmd_buffer;
            snprintf((char *)&get_cmd_buffer,4,"%d");
          }
          else {
            puVar13 = (undefined4 *)
                      (&DAT_0010505c + *(int *)(&DAT_001050ac + (long)(char)(byte)__buf[1] * 4));
          }
          printf("%s IAC %s\n",uVar15,puVar13);
          telnet_iac(*(telnet_t **)(extraout_RDX[3] + 0x10),(uchar)__buf[1]);
          return extraout_EAX_02;
        case (int *)0x3:
          uVar15 = *extraout_RDX;
          uVar11 = __buf[2];
          pcVar12 = get_opt((byte)uVar11);
          printf("%s IAC WILL %d (%s)\n",uVar15,(ulong)(byte)uVar11,pcVar12);
          telnet = *(telnet_t **)(extraout_RDX[3] + 0x10);
          uVar11 = (uint)(byte)__buf[2];
          cmd = 0xfb;
          break;
        case (int *)0x4:
          uVar15 = *extraout_RDX;
          uVar11 = __buf[2];
          pcVar12 = get_opt((byte)uVar11);
          printf("%s IAC WONT %d (%s)\n",uVar15,(ulong)(byte)uVar11,pcVar12);
          telnet = *(telnet_t **)(extraout_RDX[3] + 0x10);
          uVar11 = (uint)(byte)__buf[2];
          cmd = 0xfc;
          break;
        case (int *)0x5:
          uVar15 = *extraout_RDX;
          uVar11 = __buf[2];
          pcVar12 = get_opt((byte)uVar11);
          printf("%s IAC DO %d (%s)\n",uVar15,(ulong)(byte)uVar11,pcVar12);
          telnet = *(telnet_t **)(extraout_RDX[3] + 0x10);
          uVar11 = (uint)(byte)__buf[2];
          cmd = 0xfd;
          break;
        case (int *)0x6:
          uVar15 = *extraout_RDX;
          uVar11 = __buf[2];
          pcVar12 = get_opt((byte)uVar11);
          printf("%s IAC DONT %d (%s)\n",uVar15,(ulong)(byte)uVar11,pcVar12);
          telnet = *(telnet_t **)(extraout_RDX[3] + 0x10);
          uVar11 = (uint)(byte)__buf[2];
          cmd = 0xfe;
          break;
        case (int *)0x7:
          uVar15 = *extraout_RDX;
          uVar11 = __buf[7];
          pcVar12 = get_opt((byte)uVar11);
          printf("%s SUB %d (%s)",uVar15,(ulong)(byte)uVar11,pcVar12);
          if (*(long *)(__buf + 4) != 0) {
            printf(" [%ld bytes]: ");
            print_buffer(*(char **)(__buf + 2),*(size_t *)(__buf + 4));
          }
          putchar(10);
          telnet_subnegotiation
                    (*(telnet_t **)(extraout_RDX[3] + 0x10),(uint)(byte)__buf[7],
                     *(char **)(__buf + 2),*(size_t *)(__buf + 4));
          return extraout_EAX_00;
        case (int *)0x8:
          pcVar12 = "ON";
          if ((char)__buf[1] == '\0') {
            pcVar12 = "OFF";
          }
          iVar2 = printf("%s COMPRESSION %s\n",*extraout_RDX,pcVar12);
          return iVar2;
        case (int *)0x9:
          if (*(long *)(__buf + 4) == 0) goto switchD_00101aad_default;
          printf("%s ZMP [%ld params]",*extraout_RDX);
          if (*(long *)(__buf + 4) != 0) {
            lVar4 = 0;
            do {
              printf(" \"");
              pcVar12 = *(char **)(*(long *)(__buf + 2) + lVar4 * 8);
              sVar9 = strlen(pcVar12);
              print_buffer(pcVar12,sVar9);
              putchar(0x22);
              lVar4 = lVar4 + 1;
            } while (lVar4 != *(long *)(__buf + 4));
          }
          goto LAB_00101d22;
        case (int *)0xa:
          pcVar12 = "SEND";
          if ((char)__buf[1] == '\0') {
            pcVar12 = "IS";
          }
          pcVar10 = "";
          if (*(char **)(__buf + 2) != (char *)0x0) {
            pcVar10 = *(char **)(__buf + 2);
          }
          iVar2 = printf("%s TTYPE %s %s",*extraout_RDX,pcVar12,pcVar10);
          return iVar2;
        case (int *)0xb:
          pcVar12 = "INFO";
          if ((char)__buf[6] == '\x01') {
            pcVar12 = "SEND";
          }
          pcVar10 = "IS";
          if ((char)__buf[6] != '\0') {
            pcVar10 = pcVar12;
          }
          printf("%s ENVIRON (%s) [%ld parts]",*extraout_RDX,pcVar10,*(undefined8 *)(__buf + 4));
          if (*(long *)(__buf + 4) != 0) {
            lVar14 = 0;
            lVar4 = 0;
            do {
              pcVar12 = "USERVAR";
              if (*(char *)(*(long *)(__buf + 2) + lVar14) == '\0') {
                pcVar12 = "VAR";
              }
              printf(" %s \"",pcVar12);
              pcVar12 = *(char **)(*(long *)(__buf + 2) + 8 + lVar14);
              if (pcVar12 != (char *)0x0) {
                sVar9 = strlen(pcVar12);
                print_buffer(pcVar12,sVar9);
              }
              if ((char)__buf[6] != '\x01') {
                printf("\"=\"");
                pcVar12 = *(char **)(*(long *)(__buf + 2) + 0x10 + lVar14);
                if (pcVar12 != (char *)0x0) {
                  sVar9 = strlen(pcVar12);
                  print_buffer(pcVar12,sVar9);
                }
                putchar(0x22);
              }
              lVar4 = lVar4 + 1;
              lVar14 = lVar14 + 0x18;
            } while (lVar4 != *(long *)(__buf + 4));
          }
LAB_00101d22:
          iVar2 = putchar(10);
          return iVar2;
        case (int *)0xc:
          printf("%s MSSP [%ld parts]",*extraout_RDX,*(undefined8 *)(__buf + 4));
          if (*(long *)(__buf + 4) != 0) {
            lVar14 = 0;
            lVar4 = 0;
            do {
              printf(" \"");
              pcVar12 = *(char **)(*(long *)(__buf + 2) + 8 + lVar14);
              sVar9 = strlen(pcVar12);
              print_buffer(pcVar12,sVar9);
              printf("\"=\"");
              pcVar12 = *(char **)(*(long *)(__buf + 2) + 0x10 + lVar14);
              sVar9 = strlen(pcVar12);
              print_buffer(pcVar12,sVar9);
              putchar(0x22);
              lVar4 = lVar4 + 1;
              lVar14 = lVar14 + 0x18;
            } while (lVar4 != *(long *)(__buf + 4));
          }
          goto LAB_00101d22;
        case (int *)0xd:
          iVar2 = printf("%s WARNING: %s in %s,%d: %s\n",*extraout_RDX,*(undefined8 *)(__buf + 4),
                         *(undefined8 *)(__buf + 2),(ulong)__buf[8],*(undefined8 *)(__buf + 6));
          return iVar2;
        case (int *)0xe:
          goto switchD_00101aad_caseD_e;
        }
        telnet_negotiate(telnet,cmd,uVar11);
        return extraout_EAX_01;
      }
    }
    else {
      telnet_recv(local_280,(char *)buffer_00,(ulong)(local_2f0 & 0x7fffffff));
    }
  }
  goto LAB_001018d3;
LAB_00101e2d:
  do {
    sVar5 = send(iVar2,__buf,(long)(int)lVar4,0);
    iVar3 = (int)sVar5;
    if (iVar3 == -1) {
      piVar6 = __errno_location();
      if ((*piVar6 != 4) && (*piVar6 != 0x68)) {
        _event_handler_cold_2();
      }
      break;
    }
    if (iVar3 == 0) {
      _event_handler_cold_1();
switchD_00101aad_caseD_e:
      printf("%s ERROR: %s in %s,%d: %s\n",*extraout_RDX,*(undefined8 *)(__buf + 4),
             *(undefined8 *)(__buf + 2),(ulong)__buf[8],*(undefined8 *)(__buf + 6),uVar15,argv,
             buffer_00,ppcVar7,__addr,pcVar16,__fds);
      exit(1);
    }
    piVar6 = (int *)(long)iVar3;
    __buf = (uint *)((long)__buf + (long)piVar6);
    lVar4 = lVar4 - (long)piVar6;
  } while (lVar4 != 0);
switchD_00101aad_default:
  return (int)piVar6;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	short listen_port;
	SOCKET listen_sock;
	int rs;
	struct sockaddr_in addr;
	socklen_t addrlen;
	struct pollfd pfd[2];
	struct conn_t server;
	struct conn_t client;
	struct addrinfo *ai;
	struct addrinfo hints;

	/* initialize Winsock */
#if defined(_WIN32)
	WSADATA wsd;
	WSAStartup(MAKEWORD(2, 2), &wsd);
#endif

	/* check usage */
	if (argc != 4) {
		fprintf(stderr, "Usage:\n ./telnet-proxy <remote ip> <remote port> "
				"<local port>\n");
		return 1;
	}

	/* parse listening port */
	listen_port = (short)strtol(argv[3], 0, 10);

	/* loop forever, until user kills process */
	for (;;) {
		/* create listening socket */
		if ((listen_sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
			fprintf(stderr, "socket() failed: %s\n", strerror(errno));
			return 1;
		}

		/* reuse address option */
		rs = 1;
		setsockopt(listen_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&rs, sizeof(rs));

		/* bind to listening addr/port */
		memset(&addr, 0, sizeof(addr));
		addr.sin_family = AF_INET;
		addr.sin_addr.s_addr = INADDR_ANY;
		addr.sin_port = htons(listen_port);
		if (bind(listen_sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
			fprintf(stderr, "bind() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		printf("LISTENING ON PORT %d\n", listen_port);

		/* wait for client */
		if (listen(listen_sock, 1) == -1) {
			fprintf(stderr, "listen() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}
		addrlen = sizeof(addr);
		if ((client.sock = accept(listen_sock, (struct sockaddr *)&addr,
				&addrlen)) == -1) {
			fprintf(stderr, "accept() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		printf("CLIENT CONNECTION RECEIVED\n");

		/* stop listening now that we have a client */
		close(listen_sock);

		/* look up server host */
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = AF_UNSPEC;
		hints.ai_socktype = SOCK_STREAM;
		if ((rs = getaddrinfo(argv[1], argv[2], &hints, &ai)) != 0) {
			fprintf(stderr, "getaddrinfo() failed for %s: %s\n", argv[1],
					gai_strerror(rs));
			close(client.sock);
			return 1;
		}

		/* create server socket */
		if ((server.sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
			fprintf(stderr, "socket() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* bind server socket */
		memset(&addr, 0, sizeof(addr));
		addr.sin_family = AF_INET;
		if (bind(server.sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
			fprintf(stderr, "bind() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* connect */
		if (connect(server.sock, ai->ai_addr, (int)ai->ai_addrlen) == -1) {
			fprintf(stderr, "server() failed: %s\n", strerror(errno));
			close(server.sock);
			return 1;
		}

		/* free address lookup info */
		freeaddrinfo(ai);

		printf("SERVER CONNECTION ESTABLISHED\n");

		/* initialize connection structs */
		server.name = COLOR_SERVER "SERVER";
		server.remote = &client;
		client.name = COLOR_CLIENT "CLIENT";
		client.remote = &server;

		/* initialize telnet boxes */
		server.telnet = telnet_init(0, _event_handler, TELNET_FLAG_PROXY,
				&server);
		client.telnet = telnet_init(0, _event_handler, TELNET_FLAG_PROXY,
				&client);

		/* initialize poll descriptors */
		memset(pfd, 0, sizeof(pfd));
		pfd[0].fd = server.sock;
		pfd[0].events = POLLIN;
		pfd[1].fd = client.sock;
		pfd[1].events = POLLIN;

		/* loop while both connections are open */
		while (poll(pfd, 2, -1) != -1) {
			/* read from server */
			if (pfd[0].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(server.sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(server.telnet, buffer, rs);
				} else if (rs == 0) {
					printf("%s DISCONNECTED" COLOR_NORMAL "\n", server.name);
					break;
				} else {
					if (errno != EINTR && errno != ECONNRESET) {
						fprintf(stderr, "recv(server) failed: %s\n",
								strerror(errno));
						exit(1);
					}
				}
			}

			/* read from client */
			if (pfd[1].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(client.sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(client.telnet, buffer, rs);
				} else if (rs == 0) {
					printf("%s DISCONNECTED" COLOR_NORMAL "\n", client.name);
					break;
				} else {
					if (errno != EINTR && errno != ECONNRESET) {
						fprintf(stderr, "recv(server) failed: %s\n",
								strerror(errno));
						exit(1);
					}
				}
			}
		}

		/* clean up */
		telnet_free(server.telnet);
		telnet_free(client.telnet);
		close(server.sock);
		close(client.sock);

		/* all done */
		printf("BOTH CONNECTIONS CLOSED\n");
	}

	/* not that we can reach this, but GCC will cry if it's not here */
	return 0;
}